

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void __thiscall MD5Context::Final(MD5Context *this,BYTE *digest)

{
  DWORD *in;
  DWORD DVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  DWORD *__s;
  
  uVar4 = this->bytes[0] & 0x3f;
  in = this->in;
  __s = (DWORD *)((long)this->in + (ulong)uVar4 + 1);
  *(undefined1 *)((long)this->in + (ulong)uVar4) = 0x80;
  uVar3 = 0x37 - uVar4;
  if (0x37 < uVar4) {
    memset(__s,0,(ulong)(uVar4 ^ 0x3f));
    MD5Transform(this->buf,in);
    uVar3 = 0x38;
    __s = in;
  }
  memset(__s,0,(ulong)uVar3);
  uVar3 = this->bytes[0];
  DVar1 = this->bytes[1];
  this->in[0xe] = uVar3 * 8;
  this->in[0xf] = DVar1 << 3 | uVar3 >> 0x1d;
  MD5Transform(this->buf,in);
  uVar2 = *(undefined8 *)(this->buf + 2);
  *(undefined8 *)digest = *(undefined8 *)this->buf;
  *(undefined8 *)(digest + 8) = uVar2;
  this->bytes[0] = 0;
  this->bytes[1] = 0;
  this->in[0] = 0;
  this->in[1] = 0;
  this->in[2] = 0;
  this->in[3] = 0;
  this->in[4] = 0;
  this->in[5] = 0;
  this->in[6] = 0;
  this->in[7] = 0;
  this->in[8] = 0;
  this->in[9] = 0;
  this->in[10] = 0;
  this->in[0xb] = 0;
  this->in[0xc] = 0;
  this->in[0xd] = 0;
  this->buf[0] = 0;
  this->buf[1] = 0;
  this->buf[2] = 0;
  this->buf[3] = 0;
  this->in[0xe] = 0;
  this->in[0xf] = 0;
  return;
}

Assistant:

void MD5Context::Final(BYTE digest[16])
{
	int count = bytes[0] & 0x3f;	/* Number of bytes in ctx->in */
	BYTE *p = (BYTE *)in + count;

	/* Set the first char of padding to 0x80.  There is always room. */
	*p++ = 0x80;

	/* Bytes of padding needed to make 56 bytes (-8..55) */
	count = 56 - 1 - count;

	if (count < 0)		/* Padding forces an extra block */
	{
		memset(p, 0, count + 8);
		byteSwap(in, 16);
		MD5Transform(buf, in);
		p = (BYTE *)in;
		count = 56;
	}
	memset(p, 0, count);
	byteSwap(in, 14);

	/* Append length in bits and transform */
	in[14] = bytes[0] << 3;
	in[15] = (bytes[1] << 3) | (bytes[0] >> 29);
	MD5Transform(buf, in);

	byteSwap(buf, 4);
	memcpy(digest, buf, 16);
	memset(this, 0, sizeof(*this));	/* In case it's sensitive */
}